

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_quick_sort_recursive(int64_t *dst,size_t original_left,size_t original_right)

{
  long *plVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  
  uVar7 = original_right - original_left;
  if (original_left <= original_right && uVar7 != 0) {
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    uVar12 = 0;
    do {
      uVar8 = original_right - original_left;
      uVar7 = uVar8 + 1;
      if (uVar7 < 0x11) {
        sorter_bitonic_sort(dst + original_left,uVar7);
        return;
      }
      if ((uVar12 ^ (uint)lVar5 ^ 0x3f) == 0x3f) {
        sorter_heap_sort(dst + original_left,uVar7);
        return;
      }
      uVar12 = uVar12 + 1;
      sVar11 = (uVar8 >> 1) + original_left;
      lVar2 = dst[original_right];
      sVar10 = original_left;
      if (dst[original_left] < lVar2) {
        sVar10 = original_right;
      }
      sVar14 = sVar11;
      if (dst[sVar11] < lVar2) {
        sVar14 = original_right;
        sVar10 = sVar11;
      }
      if (dst[original_left] < dst[sVar11]) {
        sVar14 = sVar10;
      }
      sVar9 = (uVar8 >> 2) + original_left;
      sVar11 = (original_right - sVar11 >> 1) + sVar11;
      sVar10 = sVar9;
      if (dst[sVar9] < dst[sVar11]) {
        sVar10 = sVar11;
      }
      plVar1 = dst + sVar14;
      if (dst[sVar11] <= *plVar1) {
        sVar11 = sVar14;
        sVar14 = sVar10;
      }
      if (dst[sVar9] < *plVar1) {
        sVar11 = sVar14;
      }
      iVar3 = dst[sVar11];
      dst[sVar11] = lVar2;
      dst[original_right] = iVar3;
      uVar6 = 0;
      sVar10 = original_left;
      sVar11 = original_left;
      do {
        iVar4 = dst[sVar10];
        uVar13 = (int)iVar4 - (int)iVar3;
        if ((int)uVar13 < 0) {
          dst[sVar10] = dst[sVar11];
          dst[sVar11] = iVar4;
          sVar11 = sVar11 + 1;
        }
        uVar6 = uVar6 | uVar13;
        sVar10 = sVar10 + 1;
      } while (original_right != sVar10);
      iVar3 = dst[original_right];
      dst[original_right] = dst[sVar11];
      dst[sVar11] = iVar3;
      if (uVar6 == 0) {
        return;
      }
      if (sVar11 == 0xffffffffffffffff) {
        return;
      }
      sVar10 = sVar11 - 1;
      if (~sVar11 + original_right < sVar10 - original_left) {
        sorter_quick_sort_recursive(dst,sVar11 + 1,original_right);
        original_right = sVar10;
      }
      else {
        sorter_quick_sort_recursive(dst,original_left,sVar10);
        original_left = sVar11 + 1;
      }
    } while (original_left < original_right);
  }
  return;
}

Assistant:

static void QUICK_SORT_RECURSIVE(SORT_TYPE *dst, const size_t original_left,
                                 const size_t original_right) {
  size_t left;
  size_t right;
  size_t pivot;
  size_t new_pivot;
  size_t middle;
  int loop_count = 0;
  const int max_loops = 64 - CLZ(original_right - original_left); /* ~lg N */
  left = original_left;
  right = original_right;

  while (1) {
    if (right <= left) {
      return;
    }

    if ((right - left + 1U) <= SMALL_SORT_BND) {
      SMALL_SORT(&dst[left], right - left + 1U);
      return;
    }

    if (++loop_count >= max_loops) {
      /* we have recursed / looped too many times; switch to heap sort */
      HEAP_SORT(&dst[left], right - left + 1U);
      return;
    }

    /* median of 5 */
    middle = left + ((right - left) >> 1);
    pivot = MEDIAN((const SORT_TYPE *)dst, left, middle, right);
    pivot = MEDIAN((const SORT_TYPE *)dst, left + ((middle - left) >> 1), pivot,
                   middle + ((right - middle) >> 1));
    new_pivot = QUICK_SORT_PARTITION(dst, left, right, pivot);

    /* check for partition all equal */
    if (new_pivot == SIZE_MAX) {
      return;
    }

    /* recurse only on the small part to avoid degenerate stack sizes */
    /* and manually do tail call on the large part */
    if (new_pivot - 1U - left > right - new_pivot - 1U) {
      /* left is bigger than right */
      QUICK_SORT_RECURSIVE(dst, new_pivot + 1U, right);
      /* tail call for left */
      right = new_pivot - 1U;
    } else {
      /* right is bigger than left */
      QUICK_SORT_RECURSIVE(dst, left, new_pivot - 1U);
      /* tail call for right */
      left = new_pivot + 1U;
    }
  }
}